

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcShaderLoopTests.cpp
# Opt level: O2

void __thiscall
deqp::ShaderLoopCase::ShaderLoopCase
          (ShaderLoopCase *this,Context *context,char *name,char *description,bool isVertexCase,
          ShaderEvalFunc evalFunc,char *vertShaderSource,char *fragShaderSource)

{
  ShaderRenderCase::ShaderRenderCase
            (&this->super_ShaderRenderCase,context->m_testCtx,context->m_renderCtx,
             context->m_contextInfo,name,description,isVertexCase,evalFunc);
  (this->super_ShaderRenderCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__ShaderLoopCase_01e060a0;
  std::__cxx11::string::assign((char *)&(this->super_ShaderRenderCase).m_vertShaderSource);
  std::__cxx11::string::assign((char *)&(this->super_ShaderRenderCase).m_fragShaderSource);
  return;
}

Assistant:

ShaderLoopCase::ShaderLoopCase(Context& context, const char* name, const char* description, bool isVertexCase,
							   ShaderEvalFunc evalFunc, const char* vertShaderSource, const char* fragShaderSource)
	: ShaderRenderCase(context.getTestContext(), context.getRenderContext(), context.getContextInfo(), name,
					   description, isVertexCase, evalFunc)
{
	m_vertShaderSource = vertShaderSource;
	m_fragShaderSource = fragShaderSource;
}